

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void ImPlot::RenderHeatmap<long_long,ImPlot::TransformerLogLin>
               (TransformerLogLin transformer,ImDrawList *DrawList,longlong *values,int rows,
               int cols,double scale_min,double scale_max,char *fmt,ImPlotPoint *bounds_min,
               ImPlotPoint *bounds_max)

{
  ImVec2 IVar1;
  undefined8 uVar2;
  ImPlotPlot *pIVar3;
  ImPlotContext *pIVar4;
  ImPlotContext *pIVar5;
  longlong *plVar6;
  long lVar7;
  ImU32 col;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  undefined4 extraout_XMM0_Dc;
  undefined4 uVar14;
  undefined4 extraout_XMM0_Dd;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  ImVec4 IVar22;
  ImVec2 a;
  ImVec2 b;
  ImVec4 color;
  ImVec2 local_138;
  int local_12c;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined1 local_118 [16];
  double local_108;
  double local_100;
  longlong *local_f8;
  char *local_f0;
  long local_e8;
  long local_e0;
  double local_d8;
  long local_d0;
  ulong local_c8;
  double local_c0;
  ImDrawList *local_b8;
  double local_b0;
  double local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [24];
  double local_80;
  ulong local_78;
  ImPlotContext *local_70;
  double local_68;
  ImVec2 local_60;
  undefined1 local_58 [12];
  float fStack_4c;
  
  if (0 < rows) {
    dVar18 = (bounds_max->x - bounds_min->x) / (double)cols;
    local_100 = (bounds_max->y - bounds_min->y) / (double)rows;
    dVar17 = dVar18 * 0.5;
    dVar20 = local_100 * 0.5;
    lVar12 = (long)transformer.YAxis;
    local_b0 = scale_max - scale_min;
    local_c8 = (ulong)(uint)cols;
    uVar8 = 0;
    local_108 = local_100 * 0.5;
    dVar19 = dVar18 * 0.5;
    local_d0 = lVar12 * 0x10;
    lVar9 = lVar12 << 7;
    dVar21 = 0.0;
    iVar11 = 0;
    local_70 = GImPlot;
    lVar13 = lVar12;
    local_128 = dVar20;
    local_f8 = values;
    local_f0 = fmt;
    local_e8 = lVar9;
    local_e0 = lVar12;
    local_d8 = scale_min;
    local_c0 = dVar18;
    local_b8 = DrawList;
    local_68 = dVar19;
    do {
      plVar6 = local_f8;
      if (0 < cols) {
        dVar15 = local_100 * dVar21 + local_108;
        dVar16 = 0.0;
        lVar9 = 0;
        local_12c = iVar11;
        local_80 = dVar21;
        local_78 = uVar8;
        do {
          pIVar4 = GImPlot;
          local_98._0_8_ = dVar16;
          dVar21 = dVar16 * dVar18 + bounds_min->x + dVar19;
          local_118._0_8_ = bounds_max->y - dVar15;
          local_118._8_8_ = 0;
          local_a8 = (double)local_118._0_8_ - dVar20;
          uStack_a0 = 0;
          dVar18 = log10((dVar21 - dVar17) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          lVar7 = local_e0;
          lVar13 = local_e8;
          pIVar5 = GImPlot;
          pIVar3 = pIVar4->CurrentPlot;
          dVar19 = (pIVar3->XAxis).Range.Min;
          IVar1 = pIVar4->PixelRange[lVar12].Min;
          local_138.y = (float)(pIVar4->My[local_e0] *
                                (local_a8 -
                                *(double *)((long)&pIVar3->YAxis[0].Range.Min + local_e8)) +
                               (double)IVar1.y);
          local_138.x = (float)(pIVar4->Mx *
                                (((double)(float)(dVar18 / pIVar4->LogDenX) *
                                  ((pIVar3->XAxis).Range.Max - dVar19) + dVar19) - dVar19) +
                               (double)IVar1.x);
          uVar14 = local_118._12_4_;
          local_118._8_4_ = local_118._8_4_;
          local_118._0_8_ = local_118._0_8_ + local_128;
          local_118._12_4_ = uVar14;
          dVar18 = log10((dVar21 + dVar17) / (GImPlot->CurrentPlot->XAxis).Range.Min);
          pIVar4 = local_70;
          pIVar3 = pIVar5->CurrentPlot;
          dVar19 = (pIVar3->XAxis).Range.Min;
          IVar1 = pIVar5->PixelRange[lVar12].Min;
          local_60.y = (float)(pIVar5->My[lVar7] *
                               ((double)local_118._0_8_ -
                               *(double *)((long)&pIVar3->YAxis[0].Range.Min + lVar13)) +
                              (double)IVar1.y);
          local_60.x = (float)(pIVar5->Mx *
                               (((double)(float)(dVar18 / pIVar5->LogDenX) *
                                 ((pIVar3->XAxis).Range.Max - dVar19) + dVar19) - dVar19) +
                              (double)IVar1.x);
          IVar22 = LerpColormap((float)(((double)plVar6[(int)uVar8 + lVar9] - local_d8) / local_b0 +
                                       0.0));
          local_58 = IVar22._0_12_;
          fStack_4c = IVar22.w * (pIVar4->Style).FillAlpha;
          col = ImGui::GetColorU32((ImVec4 *)local_58);
          ImDrawList::AddRectFilled(local_b8,&local_138,&local_60,col,0.0,0xf);
          dVar16 = (double)local_98._0_8_ + 1.0;
          lVar9 = lVar9 + 1;
          dVar18 = local_c0;
          dVar19 = local_68;
          dVar20 = local_128;
        } while ((int)local_c8 != (int)lVar9);
        uVar8 = (ulong)(uint)((int)local_78 + (int)lVar9);
        lVar9 = local_e8;
        lVar13 = local_e0;
        dVar21 = local_80;
        iVar11 = local_12c;
      }
      dVar21 = dVar21 + 1.0;
      iVar11 = iVar11 + 1;
    } while (iVar11 != rows);
    if (local_f0 != (char *)0x0 && 0 < rows) {
      iVar11 = 0;
      dVar19 = 0.0;
      iVar10 = 0;
      do {
        plVar6 = local_f8;
        if (0 < cols) {
          dVar21 = local_100 * dVar19 + local_108;
          local_a8 = (double)CONCAT44(local_a8._4_4_,iVar11);
          dVar20 = 0.0;
          lVar12 = 0;
          do {
            pIVar4 = GImPlot;
            local_118._0_8_ = dVar20;
            local_128 = (bounds_min->y + 1.0) - dVar21;
            uStack_120 = 0;
            dVar18 = log10((dVar20 * dVar18 + bounds_min->x + dVar17) /
                           (GImPlot->CurrentPlot->XAxis).Range.Min);
            pIVar3 = pIVar4->CurrentPlot;
            dVar15 = (pIVar3->XAxis).Range.Min;
            uVar2 = *(undefined8 *)((long)&pIVar4->PixelRange[0].Min.x + local_d0);
            dVar20 = local_128 - *(double *)((long)&pIVar3->YAxis[0].Range.Min + lVar9);
            local_128._0_4_ =
                 (float)(pIVar4->Mx *
                         (((double)(float)(dVar18 / pIVar4->LogDenX) *
                           ((pIVar3->XAxis).Range.Max - dVar15) + dVar15) - dVar15) +
                        (double)(float)uVar2);
            local_128._4_4_ =
                 (float)(pIVar4->My[lVar13] * dVar20 + (double)(float)((ulong)uVar2 >> 0x20));
            uStack_120 = 0;
            sprintf(local_58,local_f0,plVar6[iVar11 + lVar12]);
            IVar1 = ImGui::CalcTextSize(local_58,(char *)0x0,false,-1.0);
            local_98._8_4_ = extraout_XMM0_Dc;
            local_98._0_4_ = IVar1.x;
            local_98._4_4_ = IVar1.y;
            local_98._12_4_ = extraout_XMM0_Dd;
            IVar22 = LerpColormap((float)(((double)plVar6[iVar11 + lVar12] - local_d8) / local_b0 +
                                         0.0));
            local_138.y = (float)local_98._4_4_ * -0.5 + local_128._4_4_;
            local_138.x = (float)local_98._0_4_ * -0.5 + (float)local_128;
            ImDrawList::AddText(local_b8,&local_138,
                                -(uint)(IVar22.z * 0.114 + IVar22.x * 0.299 + IVar22.y * 0.587 <=
                                       0.5) | 0xff000000,local_58,(char *)0x0);
            dVar20 = (double)local_118._0_8_ + 1.0;
            lVar12 = lVar12 + 1;
            dVar18 = local_c0;
          } while ((int)local_c8 != (int)lVar12);
          iVar11 = local_a8._0_4_ + (int)lVar12;
        }
        dVar19 = dVar19 + 1.0;
        iVar10 = iVar10 + 1;
      } while (iVar10 != rows);
    }
  }
  return;
}

Assistant:

void RenderHeatmap(Transformer transformer, ImDrawList& DrawList, const T* values, int rows, int cols, double scale_min, double scale_max, const char* fmt, const ImPlotPoint& bounds_min, const ImPlotPoint& bounds_max) {
    ImPlotContext& gp = *GImPlot;
    const double w = (bounds_max.x - bounds_min.x) / cols;
    const double h = (bounds_max.y - bounds_min.y) / rows;
    const ImPlotPoint half_size(w*0.5,h*0.5);
    int i = 0;
    for (int r = 0; r < rows; ++r) {
        for (int c = 0; c < cols; ++c) {
            ImPlotPoint p;
            p.x = bounds_min.x + 0.5*w + c*w;
            p.y = bounds_max.y - (0.5*h + r*h);
            ImVec2 a  = transformer(ImPlotPoint(p.x - half_size.x, p.y - half_size.y));
            ImVec2 b  = transformer(ImPlotPoint(p.x + half_size.x, p.y + half_size.y));
            double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
            ImVec4 color = LerpColormap((float)t);
            color.w *= gp.Style.FillAlpha;
            ImU32 col = ImGui::GetColorU32(color);
            DrawList.AddRectFilled(a, b, col);
            i++;
        }
    }
    if (fmt != NULL) {
        i = 0;
        for (int r = 0; r < rows; ++r) {
            for (int c = 0; c < cols; ++c) {
                ImPlotPoint p;
                p.x = bounds_min.x + 0.5*w + c*w;
                p.y = bounds_min.y + 1 - (0.5*h + r*h);
                ImVec2 px = transformer(p);
                char buff[32];
                sprintf(buff, fmt, values[i]);
                ImVec2 size = ImGui::CalcTextSize(buff);
                double t = ImRemap((double)values[i], scale_min, scale_max, 0.0, 1.0);
                ImVec4 color = LerpColormap((float)t);
                ImU32 col = CalcTextColor(color);
                DrawList.AddText(px - size * 0.5f, col, buff);
                i++;
            }
        }
    }
}